

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

bool __thiscall
ON_Matrix::BackSolve
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int Bsize,int Bpt_stride,double *Bpt,
          int Xpt_stride,double *Xpt)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double **ppdVar4;
  double *pdVar5;
  bool bVar6;
  ulong uVar7;
  bool bVar8;
  double ***pppdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  
  iVar2 = this->m_col_count;
  lVar12 = (long)iVar2;
  iVar3 = this->m_row_count;
  if ((iVar3 < iVar2) || (uVar7 = (ulong)(uint)pt_dim, iVar3 < Bsize || Bsize < iVar2)) {
LAB_004f9c18:
    bVar8 = false;
  }
  else {
    if (iVar2 < Bsize) {
      pdVar14 = Bpt + lVar12 * Bpt_stride;
      lVar15 = lVar12;
      do {
        if (0 < pt_dim) {
          uVar16 = 0;
          do {
            if (zero_tolerance < ABS(pdVar14[uVar16])) goto LAB_004f9c18;
            uVar16 = uVar16 + 1;
          } while (uVar7 != uVar16);
        }
        lVar15 = lVar15 + 1;
        pdVar14 = pdVar14 + Bpt_stride;
      } while ((int)lVar15 != Bsize);
    }
    pppdVar9 = &this->m;
    if (iVar3 == (this->m_rowmem).m_count) {
      pppdVar9 = &(this->m_rowmem).m_a;
    }
    ppdVar4 = *pppdVar9;
    if (Xpt == Bpt) {
      bVar8 = true;
      if (1 < iVar2) {
        lVar13 = (long)Xpt_stride;
        lVar15 = lVar12 + -1;
        pdVar14 = Xpt + lVar13 * (lVar12 + -2);
        pdVar17 = Xpt + lVar13 * lVar15;
        lVar10 = lVar12 + -2;
        do {
          lVar12 = lVar12 + -1;
          if (lVar10 < lVar15) {
            pdVar5 = ppdVar4[lVar10];
            lVar18 = lVar12;
            pdVar11 = pdVar17;
            do {
              if (0 < pt_dim) {
                dVar1 = pdVar5[lVar18];
                uVar16 = 0;
                do {
                  pdVar14[uVar16] = pdVar11[uVar16] * -dVar1 + pdVar14[uVar16];
                  uVar16 = uVar16 + 1;
                } while (uVar7 != uVar16);
              }
              lVar18 = lVar18 + 1;
              pdVar11 = pdVar11 + lVar13;
            } while (iVar2 != (int)lVar18);
          }
          pdVar14 = pdVar14 + -lVar13;
          pdVar17 = pdVar17 + -lVar13;
          bVar6 = 0 < lVar10;
          lVar10 = lVar10 + -1;
        } while (bVar6);
      }
    }
    else {
      memcpy(Xpt + (iVar2 + -1) * Xpt_stride,Bpt + (iVar2 + -1) * Bpt_stride,(long)(pt_dim * 8));
      lVar12 = (long)this->m_col_count;
      bVar8 = true;
      if (1 < lVar12) {
        lVar15 = (long)(this->m_col_count + -2);
        lVar10 = (long)Xpt_stride;
        pdVar14 = Xpt + lVar10 * lVar15;
        pdVar17 = Xpt + (lVar12 + -1) * lVar10;
        do {
          lVar12 = lVar12 + -1;
          memcpy(Xpt + lVar15 * lVar10,Bpt + lVar15 * Bpt_stride,(long)(pt_dim * 8));
          iVar2 = this->m_col_count;
          if (lVar15 + 1 < (long)iVar2) {
            pdVar5 = ppdVar4[lVar15];
            pdVar11 = pdVar17;
            lVar13 = lVar12;
            do {
              if (0 < pt_dim) {
                dVar1 = pdVar5[lVar13];
                uVar16 = 0;
                do {
                  pdVar14[uVar16] = pdVar11[uVar16] * -dVar1 + pdVar14[uVar16];
                  uVar16 = uVar16 + 1;
                } while (uVar7 != uVar16);
              }
              lVar13 = lVar13 + 1;
              pdVar11 = pdVar11 + lVar10;
            } while (iVar2 != (int)lVar13);
          }
          pdVar14 = pdVar14 + -lVar10;
          pdVar17 = pdVar17 + -lVar10;
          bVar8 = 0 < lVar15;
          lVar15 = lVar15 + -1;
        } while (bVar8);
        bVar8 = true;
      }
    }
  }
  return bVar8;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int pt_dim,
    int Bsize,
    int Bpt_stride,
    const double* Bpt,
    int Xpt_stride,
    double* Xpt
    ) const
{
  const int sizeof_pt = pt_dim*sizeof(double);
  double mij;
  int i, j, k;
  const double* Bi;
  double* Xi;
  double* Xj;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) 
  {
    Bi = Bpt + i*Bpt_stride;
    for( j = 0; j < pt_dim; j++ )
    {
      if ( fabs(Bi[j]) > zero_tolerance )
        return false; // over determined
    }
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( Xpt != Bpt )
  {
    Xi = Xpt + (m_col_count-1)*Xpt_stride;
    Bi = Bpt + (m_col_count-1)*Bpt_stride;
    memcpy(Xi,Bi,sizeof_pt);
    for ( i = m_col_count-2; i >= 0; i-- ) {
      Xi = Xpt + i*Xpt_stride;
      Bi = Bpt + i*Bpt_stride;
      memcpy(Xi,Bi,sizeof_pt);
      for ( j = i+1; j < m_col_count; j++ ) {
        Xj = Xpt + j*Xpt_stride;
        mij = this_m[i][j];
        for ( k = 0; k < pt_dim; k++ )
          Xi[k] -= mij*Xj[k];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      Xi = Xpt + i*Xpt_stride;
      for ( j = i+1; j < m_col_count; j++ ) {
        Xj = Xpt + j*Xpt_stride;
        mij = this_m[i][j];
        for ( k = 0; k < pt_dim; k++ )
          Xi[k] -= mij*Xj[k];
      }
    }
  }

  return true;
}